

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

float distance(Point *a,Point *b)

{
  float fVar1;
  Point PVar2;
  Vector local_50 [3];
  Vector local_24;
  Point *local_18;
  Point *b_local;
  Point *a_local;
  
  local_18 = b;
  b_local = a;
  PVar2 = operator-(*b,a);
  local_50[0]._0_8_ = PVar2._0_8_;
  local_24.x = local_50[0].x;
  local_24.y = local_50[0].y;
  local_50[0].z = PVar2.z;
  local_24.z = local_50[0].z;
  fVar1 = vectorLen(&local_24);
  return fVar1;
}

Assistant:

float distance(Point const& a, Point const& b)
{
  return vectorLen(b - a);
}